

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::shaderexecutor::
FuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::createInstance(FuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *this,Context *context)

{
  Context *context_00;
  int iVar1;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
  *this_00;
  undefined4 extraout_var;
  StatementP local_120;
  Variables<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
  local_110;
  CaseContext local_a0;
  Context *local_18;
  Context *context_local;
  FuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  this_00 = (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
             *)operator_new(0x120);
  context_00 = local_18;
  CaseContext::CaseContext(&local_a0,&(this->super_FuncCaseBase).super_PrecisionCase.m_ctx);
  Variables<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
  ::Variables(&local_110,&this->m_variables);
  iVar1 = (*(this->super_FuncCaseBase).super_PrecisionCase.super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[7])();
  StatementP::StatementP(&local_120,&(this->super_FuncCaseBase).m_stmt);
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
  ::BuiltinPrecisionCaseTestInstance
            (this_00,context_00,&local_a0,&(this->super_FuncCaseBase).super_PrecisionCase.m_spec,
             &local_110,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)CONCAT44(extraout_var,iVar1),&local_120);
  StatementP::~StatementP(&local_120);
  Variables<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
  ::~Variables(&local_110);
  CaseContext::~CaseContext(&local_a0);
  return &this_00->super_TestInstance;
}

Assistant:

virtual	TestInstance*					createInstance	(Context& context) const
	{
		return new BuiltinPrecisionCaseTestInstance<In, Out>(context, m_ctx, m_spec, m_variables, getSamplings(), m_stmt);
	}